

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O0

int Gia_ManLevelWithBoxes_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Gia_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsAnd(pObj);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                      ,0x1d3,"int Gia_ManLevelWithBoxes_rec(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar1 = Gia_ObjId(p,pObj);
      iVar1 = Gia_ObjSibl(p,iVar1);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjId(p,pObj);
        pGVar2 = Gia_ObjSiblObj(p,iVar1);
        Gia_ManLevelWithBoxes_rec(p,pGVar2);
      }
      pGVar2 = Gia_ObjFanin0(pObj);
      iVar1 = Gia_ManLevelWithBoxes_rec(p,pGVar2);
      if (iVar1 == 0) {
        pGVar2 = Gia_ObjFanin1(pObj);
        iVar1 = Gia_ManLevelWithBoxes_rec(p,pGVar2);
        if (iVar1 == 0) {
          Gia_ObjSetAndLevel(p,pObj);
          p_local._4_4_ = 0;
        }
        else {
          p_local._4_4_ = 1;
        }
      }
      else {
        p_local._4_4_ = 1;
      }
    }
    else {
      p_local._4_4_ = 1;
    }
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManLevelWithBoxes_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return 0;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
        return 1;
    assert( Gia_ObjIsAnd(pObj) );
    if ( Gia_ObjSibl(p, Gia_ObjId(p, pObj)) )
        Gia_ManLevelWithBoxes_rec( p, Gia_ObjSiblObj(p, Gia_ObjId(p, pObj)) );
    if ( Gia_ManLevelWithBoxes_rec( p, Gia_ObjFanin0(pObj) ) )
        return 1;
    if ( Gia_ManLevelWithBoxes_rec( p, Gia_ObjFanin1(pObj) ) )
        return 1;
    Gia_ObjSetAndLevel( p, pObj );
    return 0;
}